

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O2

char ** adjustFlags(char **FLAG,int height,int width,int imax,int jmax)

{
  ulong uVar1;
  char **ppcVar2;
  ulong uVar3;
  ulong uVar4;
  char cVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  short sVar10;
  
  if (FLAG == (char **)0x0) {
    FLAG = (char **)0x0;
  }
  else {
    ppcVar2 = create2DIntegerField(imax,jmax);
    if (ppcVar2 != (char **)0x0) {
      uVar4 = 0;
      if (0 < jmax) {
        uVar4 = (ulong)(uint)jmax;
      }
      uVar3 = 0;
      if (0 < imax) {
        uVar3 = (ulong)(uint)imax;
      }
      uVar1 = 0;
      while (uVar9 = uVar1, uVar9 != uVar3) {
        uVar7 = 0;
        while (uVar1 = uVar9 + 1, uVar7 != uVar4) {
          sVar10 = 0;
          for (lVar8 = (long)(((int)uVar9 * width) / imax);
              lVar8 <= ((int)(uVar9 + 1) * width) / imax; lVar8 = lVar8 + 1) {
            for (lVar6 = (long)(((int)uVar7 * height) / jmax);
                lVar6 <= ((int)(uVar7 + 1) * height) / jmax; lVar6 = lVar6 + 1) {
              if ((lVar8 != width) && (height != lVar6)) {
                sVar10 = sVar10 + FLAG[lVar8][lVar6];
              }
            }
          }
          cVar5 = '\x0f';
          if ((width * height) / (imax * jmax * 2) < (int)sVar10) {
            cVar5 = '\0';
          }
          ppcVar2[uVar9][uVar7] = cVar5;
          uVar7 = uVar7 + 1;
        }
      }
      destroy2Dfield(FLAG,width);
      FLAG = ppcVar2;
    }
  }
  return FLAG;
}

Assistant:

char** adjustFlags (char **FLAG, int height, int width, int imax, int jmax)
{
	/* Adjust the number of cells to a predefined number */
	if (FLAG == NULL)
		return FLAG;
	char **newFLAG = create2DIntegerField(imax,jmax);
	if (newFLAG == NULL)
		return FLAG;
	short average;
	for (int i = 0; i < imax; i++)
	{
		for (int j = 0; j < jmax; j++)
		{
			average = 0;
			for (int k = (i*width)/imax; k <= ((i+1)*width)/imax; k++)
				for (int l = (j*height)/jmax; l <= ((j+1)*height)/jmax; l++)
				{
					if (k == width || l == height)
						continue;
					average += FLAG[k][l];
				}
			if (average > (width*height)/(imax*jmax*2))
				newFLAG[i][j] = C_B;
			else
				newFLAG[i][j] = C_F;
		}
	}
	destroy2Dfield((void**)FLAG,width);
	return newFLAG;
}